

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

int container_get_cardinality(container_t *c,uint8_t typecode)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  
  uVar3 = CONCAT71(in_register_00000031,typecode);
  if ((int)uVar3 == 4) {
    uVar3 = (ulong)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar3 != '\x03') {
    return ((run_container_t *)c)->n_runs;
  }
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 2) != 0) {
    iVar2 = _avx512_run_container_cardinality((run_container_t *)c);
    return iVar2;
  }
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 1) == 0) {
    uVar1 = ((run_container_t *)c)->n_runs;
    uVar3 = 0;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = uVar1 + ((run_container_t *)c)->runs[uVar3].length;
    }
    return uVar1;
  }
  iVar2 = _avx2_run_container_cardinality((run_container_t *)c);
  return iVar2;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}